

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_si_iec_units.cpp
# Opt level: O2

string * __thiscall
tlx::format_si_units_abi_cxx11_
          (string *__return_storage_ptr__,tlx *this,uint64_t number,int precision)

{
  ostream *poVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ostringstream out;
  long local_190 [2];
  uint auStack_180 [88];
  
  auVar3._8_4_ = (int)((ulong)this >> 0x20);
  auVar3._0_8_ = this;
  auVar3._12_4_ = 0x45300000;
  uVar2 = 0;
  for (dVar4 = (auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0); 1000.0 <= dVar4;
      dVar4 = dVar4 / 1000.0) {
    uVar2 = uVar2 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  *(uint *)((long)auStack_180 + *(long *)(_out + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(_out + -0x18)) & 0xfffffefb | 4;
  *(long *)((long)local_190 + *(long *)(_out + -0x18)) = (long)(int)number;
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  poVar1 = std::operator<<(poVar1,' ');
  std::operator<<(poVar1,_ZZN3tlx15format_si_unitsB5cxx11EmiE10SI_endings_rel +
                         *(int *)(_ZZN3tlx15format_si_unitsB5cxx11EmiE10SI_endings_rel +
                                 (ulong)uVar2 * 4));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string format_si_units(uint64_t number, int precision) {
    // may not overflow, std::numeric_limits<uint64_t>::max() == 16 EiB
    double multiplier = 1000.0;
    static const char* SI_endings[] = {
        "", "k", "M", "G", "T", "P", "E"
    };
    unsigned int scale = 0;
    double number_d = static_cast<double>(number);
    while (number_d >= multiplier) {
        number_d /= multiplier;
        ++scale;
    }
    std::ostringstream out;
    out << std::fixed << std::setprecision(precision) << number_d
        << ' ' << SI_endings[scale];
    return out.str();
}